

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O1

int mbedtls_aesni_has_support(uint what)

{
  long lVar1;
  
  if (mbedtls_aesni_has_support_done == '\0') {
    lVar1 = cpuid_Version_info(1);
    mbedtls_aesni_has_support::c = *(uint *)(lVar1 + 0xc);
    mbedtls_aesni_has_support_done = '\x01';
  }
  return (uint)((mbedtls_aesni_has_support::c & what) != 0);
}

Assistant:

int mbedtls_aesni_has_support( unsigned int what )
{
    static int done = 0;
    static unsigned int c = 0;

    if( ! done )
    {
        asm( "movl  $1, %%eax   \n\t"
             "cpuid             \n\t"
             : "=c" (c)
             :
             : "eax", "ebx", "edx" );
        done = 1;
    }

    return( ( c & what ) != 0 );
}